

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_set.cc
# Opt level: O3

void __thiscall sfm::FeatureSet::normalize_feature_positions(FeatureSet *this)

{
  pointer pVVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  pVVar1 = (this->positions).
           super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->positions).
                super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  if (lVar2 != 0) {
    fVar4 = (float)this->width;
    fVar5 = (float)this->height;
    fVar6 = fVar5;
    if (fVar5 <= fVar4) {
      fVar6 = fVar4;
    }
    lVar2 = lVar2 >> 3;
    lVar3 = 0;
    do {
      pVVar1[lVar3].v[0] = ((pVVar1[lVar3].v[0] + 0.5) - fVar4 * 0.5) / fVar6;
      pVVar1[lVar3].v[1] = ((pVVar1[lVar3].v[1] + 0.5) - fVar5 * 0.5) / fVar6;
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
  }
  return;
}

Assistant:

void
FeatureSet::normalize_feature_positions (void)
{
    /* Normalize image coordinates. */
    float const fwidth = static_cast<float>(this->width);
    float const fheight = static_cast<float>(this->height);
    float const fnorm = std::max(fwidth, fheight);
    for (std::size_t i = 0; i < this->positions.size(); ++i)
    {
        math::Vec2f& pos = this->positions[i];
        pos[0] = (pos[0] + 0.5f - fwidth / 2.0f) / fnorm;
        pos[1] = (pos[1] + 0.5f - fheight / 2.0f) / fnorm;
    }
}